

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O3

lzma_ret stream_encode_mt(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                         size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                         lzma_action action)

{
  pthread_mutex_t *__mutex;
  lzma_outq *outq;
  uint uVar1;
  int *piVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  lzma_ret lVar7;
  lzma_outbuf *plVar8;
  void *pvVar9;
  long lVar10;
  lzma_vli lVar11;
  undefined4 *puVar12;
  size_t sVar13;
  bool bVar14;
  long lVar15;
  mythread_condtime wait_abs;
  lzma_vli uncompressed_size;
  lzma_vli unpadded_size;
  pthread_cond_t *local_148;
  pthread_mutex_t *local_140;
  uint8_t *local_138;
  sigset_t old;
  sigset_t local_b0;
  
  local_138 = in;
  switch(*coder_ptr) {
  case 0:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    if (*(ulong *)((long)coder_ptr + 0xf8) < 0xc) {
      return LZMA_OK;
    }
    *(undefined8 *)((long)coder_ptr + 0xf8) = 0;
    *(undefined4 *)coder_ptr = 1;
  case 1:
    unpadded_size = 0;
    uncompressed_size = 0;
    __mutex = (pthread_mutex_t *)((long)coder_ptr + 0x168);
    outq = (lzma_outq *)((long)coder_ptr + 0x100);
    bVar3 = false;
    do {
      do {
        iVar5 = pthread_mutex_lock(__mutex);
        if (iVar5 != 0) goto LAB_001a08c0;
        lVar7 = *(lzma_ret *)((long)coder_ptr + 0x134);
        if (lVar7 == LZMA_OK) {
          lVar7 = lzma_outq_read(outq,out,out_pos,out_size,&unpadded_size,&uncompressed_size);
        }
        else if (lVar7 == LZMA_STREAM_END) {
          __assert_fail("ret != LZMA_STREAM_END",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x2be,
                        "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                       );
        }
        iVar5 = pthread_mutex_unlock(__mutex);
        if (iVar5 != 0) {
LAB_001a08df:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
        }
      } while ((lVar7 == LZMA_STREAM_END) &&
              (lVar7 = lzma_index_append(*(lzma_index **)((long)coder_ptr + 0x60),allocator,
                                         unpadded_size,uncompressed_size), *out_pos < out_size));
      if (lVar7 != LZMA_OK) {
LAB_001a079d:
        threads_stop((lzma_stream_coder_conflict1 *)coder_ptr,false);
        return lVar7;
      }
LAB_001a024e:
      sVar13 = *in_pos;
      lVar10 = *(long *)((long)coder_ptr + 0x150);
      if (sVar13 < in_size) {
        if (lVar10 == 0) {
          lVar7 = LZMA_OK;
          if (*(uint *)((long)coder_ptr + 0x120) < *(uint *)((long)coder_ptr + 0x118)) {
            iVar5 = pthread_mutex_lock(__mutex);
            if (iVar5 != 0) goto LAB_001a08c0;
            lVar10 = *(long *)((long)coder_ptr + 0x148);
            if (lVar10 != 0) {
              *(long *)((long)coder_ptr + 0x150) = lVar10;
              *(undefined8 *)((long)coder_ptr + 0x148) = *(undefined8 *)(lVar10 + 0x158);
            }
            iVar5 = pthread_mutex_unlock(__mutex);
            if (iVar5 != 0) goto LAB_001a08df;
            puVar12 = *(undefined4 **)((long)coder_ptr + 0x150);
            if (puVar12 == (undefined4 *)0x0) {
              if (*(uint *)((long)coder_ptr + 0x144) != *(uint *)((long)coder_ptr + 0x140)) {
                lVar10 = *(long *)((long)coder_ptr + 0x138);
                lVar15 = (ulong)*(uint *)((long)coder_ptr + 0x144) * 0x1c0;
                pvVar9 = lzma_alloc(*(size_t *)((long)coder_ptr + 8),allocator);
                *(void **)(lVar10 + 8 + lVar15) = pvVar9;
                lVar7 = LZMA_MEM_ERROR;
                if (pvVar9 != (void *)0x0) {
                  puVar12 = (undefined4 *)(lVar10 + lVar15);
                  local_140 = (pthread_mutex_t *)(puVar12 + 0x58);
                  iVar5 = pthread_mutex_init(local_140,(pthread_mutexattr_t *)0x0);
                  if (iVar5 == 0) {
                    local_148 = (pthread_cond_t *)(puVar12 + 0x62);
                    iVar5 = pthread_cond_init(local_148,(pthread_condattr_t *)0x0);
                    if (iVar5 == 0) {
                      *puVar12 = 0;
                      *(lzma_allocator **)(puVar12 + 10) = allocator;
                      *(void **)(puVar12 + 8) = coder_ptr;
                      *(undefined8 *)(puVar12 + 0xc) = 0;
                      *(undefined8 *)(puVar12 + 0xe) = 0;
                      *(undefined8 *)(puVar12 + 0x10) = 0;
                      *(undefined8 *)(puVar12 + 0x12) = 0xffffffffffffffff;
                      *(undefined8 *)(puVar12 + 0x14) = 0;
                      *(undefined8 *)(puVar12 + 0x16) = 0;
                      *(undefined8 *)(puVar12 + 0x18) = 0;
                      *(undefined8 *)(puVar12 + 0x1a) = 0;
                      *(undefined8 *)(puVar12 + 0x1c) = 0;
                      *(undefined8 *)(puVar12 + 0x1e) = 0;
                      *(undefined8 *)(puVar12 + 0x20) = 0;
                      sigfillset(&local_b0);
                      iVar5 = pthread_sigmask(2,&local_b0,(__sigset_t *)&old);
                      if (iVar5 != 0) {
LAB_001a09b8:
                        __assert_fail("ret == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                                      ,0x93,
                                      "void mythread_sigmask(int, const sigset_t *restrict, sigset_t *restrict)"
                                     );
                      }
                      iVar5 = pthread_create((pthread_t *)(puVar12 + 0x6e),(pthread_attr_t *)0x0,
                                             worker_start,puVar12);
                      iVar6 = pthread_sigmask(2,(__sigset_t *)&old,(__sigset_t *)0x0);
                      if (iVar6 != 0) goto LAB_001a09b8;
                      if (iVar5 == 0) {
                        *(int *)((long)coder_ptr + 0x144) = *(int *)((long)coder_ptr + 0x144) + 1;
                        *(undefined4 **)((long)coder_ptr + 0x150) = puVar12;
                        goto LAB_001a02d0;
                      }
                      iVar5 = pthread_cond_destroy(local_148);
                      if (iVar5 != 0) {
                        __assert_fail("ret == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                                      ,0x104,"void mythread_cond_destroy(mythread_cond *)");
                      }
                    }
                    iVar5 = pthread_mutex_destroy(local_140);
                    if (iVar5 != 0) {
                      __assert_fail("ret == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                                    ,0xbc,"void mythread_mutex_destroy(mythread_mutex *)");
                    }
                  }
                  lzma_free(*(void **)(puVar12 + 2),allocator);
                }
              }
            }
            else {
LAB_001a02d0:
              iVar5 = pthread_mutex_lock((pthread_mutex_t *)(puVar12 + 0x58));
              if (iVar5 != 0) goto LAB_001a08c0;
              puVar12 = *(undefined4 **)((long)coder_ptr + 0x150);
              *puVar12 = 1;
              *(undefined8 *)(puVar12 + 4) = 0;
              plVar8 = lzma_outq_get_buf(outq);
              lVar10 = *(long *)((long)coder_ptr + 0x150);
              *(lzma_outbuf **)(lVar10 + 0x18) = plVar8;
              iVar5 = pthread_cond_signal((pthread_cond_t *)(lVar10 + 0x188));
              if (iVar5 != 0) goto LAB_001a08fe;
              iVar5 = pthread_mutex_unlock
                                ((pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x150) + 0x160));
              lVar7 = LZMA_OK;
              if (iVar5 != 0) goto LAB_001a08df;
            }
          }
          lVar10 = *(long *)((long)coder_ptr + 0x150);
          if (lVar10 == 0) goto LAB_001a05ed;
        }
      }
      else if ((action == LZMA_RUN) || (lVar10 == 0)) goto LAB_001a05f9;
      old.__val[0] = *(unsigned_long *)(lVar10 + 0x10);
      lzma_bufcpy(local_138,in_pos,in_size,*(uint8_t **)(lVar10 + 8),old.__val,
                  *(size_t *)((long)coder_ptr + 8));
      bVar14 = true;
      if (old.__val[0] != *(unsigned_long *)((long)coder_ptr + 8)) {
        bVar14 = *in_pos == in_size && action != LZMA_RUN;
      }
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x150) + 0x160));
      if (iVar5 != 0) goto LAB_001a08c0;
      piVar2 = *(int **)((long)coder_ptr + 0x150);
      if (*piVar2 != 0) {
        *(unsigned_long *)(piVar2 + 4) = old.__val[0];
        if (bVar14) {
          *piVar2 = 2;
        }
        iVar5 = pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x62));
        if (iVar5 != 0) {
LAB_001a08fe:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x10c,"void mythread_cond_signal(mythread_cond *)");
        }
        iVar5 = pthread_mutex_unlock
                          ((pthread_mutex_t *)(*(long *)((long)coder_ptr + 0x150) + 0x160));
        if (iVar5 != 0) goto LAB_001a08df;
        if (bVar14) {
          *(undefined8 *)((long)coder_ptr + 0x150) = 0;
        }
        goto LAB_001a024e;
      }
      iVar5 = pthread_mutex_unlock((pthread_mutex_t *)(piVar2 + 0x58));
      if (iVar5 != 0) goto LAB_001a08df;
      iVar5 = pthread_mutex_lock(__mutex);
      if (iVar5 != 0) {
LAB_001a08c0:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
      }
      lVar7 = *(lzma_ret *)((long)coder_ptr + 0x134);
      iVar5 = pthread_mutex_unlock(__mutex);
      if (iVar5 != 0) goto LAB_001a08df;
LAB_001a05ed:
      if (lVar7 != LZMA_OK) goto LAB_001a079d;
      sVar13 = *in_pos;
LAB_001a05f9:
      if (sVar13 == in_size) {
        if (action == LZMA_RUN) {
          return LZMA_OK;
        }
        if (action == LZMA_FULL_BARRIER) {
          return LZMA_STREAM_END;
        }
        if (*(int *)((long)coder_ptr + 0x120) == 0) {
          if (action == LZMA_FULL_FLUSH) {
            return LZMA_STREAM_END;
          }
          if (action == LZMA_FINISH) {
            lVar7 = lzma_index_encoder_init
                              ((lzma_next_coder *)((long)coder_ptr + 0x68),allocator,
                               *(lzma_index **)((long)coder_ptr + 0x60));
            if (lVar7 != LZMA_OK) {
              return lVar7;
            }
            *(undefined4 *)coder_ptr = 2;
            lVar11 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
            *(lzma_vli *)((long)coder_ptr + 0x160) =
                 lVar11 + *(long *)((long)coder_ptr + 0x160) + 0xc;
            goto switchD_001a0127_caseD_2;
          }
        }
      }
      if (*out_pos == out_size) {
        return LZMA_OK;
      }
      uVar1 = *(uint *)((long)coder_ptr + 0x130);
      if (uVar1 != 0 && !bVar3) {
        wait_abs.tv_sec = (ulong)uVar1 / 1000;
        wait_abs.tv_nsec = (__syscall_slong_t)((uVar1 % 1000) * 1000000);
        gettimeofday((timeval *)&old,(__timezone_ptr_t)0x0);
        wait_abs.tv_sec = wait_abs.tv_sec + old.__val[0];
        wait_abs.tv_nsec = old.__val[1] * 1000 + wait_abs.tv_nsec;
        if (999999999 < wait_abs.tv_nsec) {
          wait_abs.tv_nsec = wait_abs.tv_nsec + -1000000000;
          wait_abs.tv_sec = wait_abs.tv_sec + 1;
        }
        bVar3 = true;
      }
      iVar5 = pthread_mutex_lock(__mutex);
      if (iVar5 != 0) goto LAB_001a08c0;
      bVar14 = false;
      while ((((in_size <= sVar13 || (*(long *)((long)coder_ptr + 0x148) == 0)) ||
              (*(uint *)((long)coder_ptr + 0x118) <= *(uint *)((long)coder_ptr + 0x120))) &&
             ((_Var4 = lzma_outq_is_readable(outq), !_Var4 &&
              (!(bool)(*(int *)((long)coder_ptr + 0x134) != 0 | bVar14)))))) {
        if (*(int *)((long)coder_ptr + 0x130) == 0) {
          iVar5 = pthread_cond_wait((pthread_cond_t *)((long)coder_ptr + 400),__mutex);
          if (iVar5 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
          }
        }
        else {
          iVar5 = pthread_cond_timedwait
                            ((pthread_cond_t *)((long)coder_ptr + 400),__mutex,(timespec *)&wait_abs
                            );
          if ((iVar5 != 0) && (iVar5 != 0x6e)) {
            __assert_fail("ret == 0 || ret == ETIMEDOUT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0x11f,
                          "int mythread_cond_timedwait(mythread_cond *, mythread_mutex *, const mythread_condtime *)"
                         );
          }
          bVar14 = iVar5 != 0;
        }
      }
      iVar5 = pthread_mutex_unlock(__mutex);
      if (iVar5 != 0) goto LAB_001a08df;
    } while (!bVar14);
    lVar7 = 0x20;
    break;
  case 2:
switchD_001a0127_caseD_2:
    lVar7 = (**(code **)((long)coder_ptr + 0x80))
                      (*(undefined8 *)((long)coder_ptr + 0x68),allocator,0,0,0,out,out_pos,out_size,
                       0);
    if (lVar7 != LZMA_STREAM_END) {
      return lVar7;
    }
    lVar11 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
    *(lzma_vli *)((long)coder_ptr + 0xb8) = lVar11;
    lVar7 = lzma_stream_footer_encode
                      ((lzma_stream_flags *)((long)coder_ptr + 0xb0),
                       (uint8_t *)((long)coder_ptr + 0xe8));
    if (lVar7 != LZMA_OK) {
      return LZMA_PROG_ERROR;
    }
    *(undefined4 *)coder_ptr = 3;
  case 3:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    lVar7 = (lzma_ret)(0xb < *(ulong *)((long)coder_ptr + 0xf8));
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x343,
                  "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  return lVar7;
}

Assistant:

static lzma_ret
stream_encode_mt(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_STREAM_HEADER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		if (coder->header_pos < sizeof(coder->header))
			return LZMA_OK;

		coder->header_pos = 0;
		coder->sequence = SEQ_BLOCK;

	// Fall through

	case SEQ_BLOCK: {
		// Initialized to silence warnings.
		lzma_vli unpadded_size = 0;
		lzma_vli uncompressed_size = 0;
		lzma_ret ret = LZMA_OK;

		// These are for wait_for_work().
		bool has_blocked = false;
		mythread_condtime wait_abs;

		while (true) {
			mythread_sync(coder->mutex) {
				// Check for Block encoder errors.
				ret = coder->thread_error;
				if (ret != LZMA_OK) {
					assert(ret != LZMA_STREAM_END);
					break; // Break out of mythread_sync.
				}

				// Try to read compressed data to out[].
				ret = lzma_outq_read(&coder->outq,
						out, out_pos, out_size,
						&unpadded_size,
						&uncompressed_size);
			}

			if (ret == LZMA_STREAM_END) {
				// End of Block. Add it to the Index.
				ret = lzma_index_append(coder->index,
						allocator, unpadded_size,
						uncompressed_size);

				// If we didn't fill the output buffer yet,
				// try to read more data. Maybe the next
				// outbuf has been finished already too.
				if (*out_pos < out_size)
					continue;
			}

			if (ret != LZMA_OK) {
				// coder->thread_error was set or
				// lzma_index_append() failed.
				threads_stop(coder, false);
				return ret;
			}

			// Try to give uncompressed data to a worker thread.
			ret = stream_encode_in(coder, allocator,
					in, in_pos, in_size, action);
			if (ret != LZMA_OK) {
				threads_stop(coder, false);
				return ret;
			}

			// See if we should wait or return.
			//
			// TODO: LZMA_SYNC_FLUSH and LZMA_SYNC_BARRIER.
			if (*in_pos == in_size) {
				// LZMA_RUN: More data is probably coming
				// so return to let the caller fill the
				// input buffer.
				if (action == LZMA_RUN)
					return LZMA_OK;

				// LZMA_FULL_BARRIER: The same as with
				// LZMA_RUN but tell the caller that the
				// barrier was completed.
				if (action == LZMA_FULL_BARRIER)
					return LZMA_STREAM_END;

				// Finishing or flushing isn't completed until
				// all input data has been encoded and copied
				// to the output buffer.
				if (lzma_outq_is_empty(&coder->outq)) {
					// LZMA_FINISH: Continue to encode
					// the Index field.
					if (action == LZMA_FINISH)
						break;

					// LZMA_FULL_FLUSH: Return to tell
					// the caller that flushing was
					// completed.
					if (action == LZMA_FULL_FLUSH)
						return LZMA_STREAM_END;
				}
			}

			// Return if there is no output space left.
			// This check must be done after testing the input
			// buffer, because we might want to use a different
			// return code.
			if (*out_pos == out_size)
				return LZMA_OK;

			// Neither in nor out has been used completely.
			// Wait until there's something we can do.
			if (wait_for_work(coder, &wait_abs, &has_blocked,
					*in_pos < in_size))
				return LZMA_TIMED_OUT;
		}

		// All Blocks have been encoded and the threads have stopped.
		// Prepare to encode the Index field.
		return_if_error(lzma_index_encoder_init(
				&coder->index_encoder, allocator,
				coder->index));
		coder->sequence = SEQ_INDEX;

		// Update the progress info to take the Index and
		// Stream Footer into account. Those are very fast to encode
		// so in terms of progress information they can be thought
		// to be ready to be copied out.
		coder->progress_out += lzma_index_size(coder->index)
				+ LZMA_STREAM_HEADER_SIZE;
	}

	// Fall through

	case SEQ_INDEX: {
		// Call the Index encoder. It doesn't take any input, so
		// those pointers can be NULL.
		const lzma_ret ret = coder->index_encoder.code(
				coder->index_encoder.coder, allocator,
				NULL, NULL, 0,
				out, out_pos, out_size, LZMA_RUN);
		if (ret != LZMA_STREAM_END)
			return ret;

		// Encode the Stream Footer into coder->buffer.
		coder->stream_flags.backward_size
				= lzma_index_size(coder->index);
		if (lzma_stream_footer_encode(&coder->stream_flags,
				coder->header) != LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		return coder->header_pos < sizeof(coder->header)
				? LZMA_OK : LZMA_STREAM_END;
	}

	assert(0);
	return LZMA_PROG_ERROR;
}